

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_lbd_merge2image.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  _InputArray *p_Var7;
  reference pvVar8;
  double local_ea8;
  vector<int,_std::allocator<int>_> local_e98;
  _InputArray local_e80;
  allocator local_e61;
  string local_e60 [32];
  _OutputArray local_e40;
  _OutputArray local_e28;
  _InputArray local_e10;
  Mat local_df8 [8];
  Mat color;
  undefined1 local_d98 [8];
  Mat colorf;
  int local_d34;
  float *pfStack_d30;
  int x_1;
  float *p_red;
  float *p_green;
  float *p_blue;
  float *p_edges;
  Mat local_d08 [4];
  int y_1;
  Mat local_ba8 [352];
  MatExpr local_a48 [356];
  int local_8e4;
  int local_8e0;
  int i_1;
  int height;
  int width;
  int local_8c0;
  allocator<cv::Mat> local_8b9;
  int i;
  vector<cv::Mat,_std::allocator<cv::Mat>_> planes;
  _InputArray local_888;
  _InputArray local_870;
  int local_854;
  float *pfStack_850;
  int x;
  float *p_dash;
  int testValue;
  int y;
  MatSize local_820 [8];
  Mat local_818 [8];
  Mat dashMask;
  int local_80c;
  _OutputArray local_7b8;
  Mat local_7a0 [8];
  Mat sobel;
  _InputOutputArray local_740;
  _InputArray local_728;
  Mat local_710 [352];
  _OutputArray local_5b0;
  _InputArray local_598;
  Mat local_580 [352];
  undefined1 local_420 [8];
  Mat edges;
  _OutputArray local_3c0;
  _InputArray local_3a8;
  _InputArray local_390;
  _OutputArray local_378;
  _InputArray local_360;
  _InputArray local_348;
  _OutputArray local_330;
  _InputArray local_318;
  _OutputArray local_300;
  _InputArray local_2e8;
  Mat local_2d0 [8];
  Mat dy;
  Mat local_270 [8];
  Mat dx;
  _OutputArray local_210;
  MatSize local_1f8 [8];
  _OutputArray local_1f0;
  _InputArray local_1d8;
  undefined1 local_1c0 [8];
  Mat tmp;
  Size_<int> local_15c;
  Size_<int> local_154;
  allocator local_149;
  string local_148 [32];
  string local_128 [8];
  Mat src;
  long local_118;
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  Mat lbd;
  int local_84;
  Size local_80;
  float local_28;
  int c;
  float alpha;
  int dash;
  int sobelSize;
  float threshold;
  char **argv_local;
  int argc_local;
  
  if (argc < 4) {
    std::operator<<((ostream *)&std::cerr,"Missing arguments!\n");
    poVar6 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar6 = std::operator<<(poVar6,*argv);
    poVar6 = std::operator<<(poVar6," lbd_image image_to_merge result");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    dash = 0x3e4ccccd;
    alpha = 4.2039e-45;
    bVar3 = false;
    local_28 = 0.7;
    while (iVar5 = getopt(argc,argv,"a:ds:t:"), iVar5 != -1) {
      switch(iVar5) {
      case 0x61:
        dVar2 = atof(_optarg);
        local_28 = (float)dVar2;
        break;
      default:
        break;
      case 100:
        bVar3 = true;
        break;
      case 0x73:
        alpha = (float)atoi(_optarg);
        break;
      case 0x74:
        dVar2 = atof(_optarg);
        dash = (int)(float)dVar2;
        if ((float)dash <= 0.0) {
          local_ea8 = 0.0;
        }
        else {
          local_ea8 = (double)(float)dash;
        }
        if (local_ea8 <= 1.0) {
          if ((float)dash <= 0.0) {
            dash = 0;
          }
        }
        else {
          dash = 0x3f800000;
        }
      }
    }
    pcVar1 = argv[argc + -3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
    cv::imread((string *)local_90,(int)local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    if (local_80 == (Size)0x0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Error reading; ");
      poVar6 = std::operator<<(poVar6,argv[argc + -3]);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
    }
    else {
      pcVar1 = argv[argc + -2];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,pcVar1,&local_149);
      cv::imread(local_128,(int)local_148);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      if (local_118 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error reading; ");
        poVar6 = std::operator<<(poVar6,argv[argc + -2]);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
      }
      else {
        cv::MatSize::operator()((MatSize *)&local_154);
        cv::MatSize::operator()((MatSize *)&local_15c);
        bVar4 = cv::operator!=(&local_154,&local_15c);
        if (bVar4) {
          cv::Mat::Mat((Mat *)local_1c0);
          cv::_InputArray::_InputArray(&local_1d8,(Mat *)local_128);
          cv::_OutputArray::_OutputArray(&local_1f0,(Mat *)local_1c0);
          cv::MatSize::operator()(local_1f8);
          cv::resize(0,&local_1d8,&local_1f0,local_1f8,1);
          cv::_OutputArray::~_OutputArray(&local_1f0);
          cv::_InputArray::~_InputArray(&local_1d8);
          cv::_OutputArray::_OutputArray(&local_210,(Mat *)local_128);
          cv::Mat::copyTo((_OutputArray *)local_1c0);
          cv::_OutputArray::~_OutputArray(&local_210);
          cv::Mat::~Mat((Mat *)local_1c0);
        }
        cv::Mat::Mat(local_270);
        cv::Mat::Mat(local_2d0);
        cv::_InputArray::_InputArray(&local_2e8,(Mat *)local_128);
        cv::_OutputArray::_OutputArray(&local_300,local_270);
        cv::Sobel(&local_2e8,&local_300,5,1,0,(int)alpha,1.0,0.0,4);
        cv::_OutputArray::~_OutputArray(&local_300);
        cv::_InputArray::~_InputArray(&local_2e8);
        cv::_InputArray::_InputArray(&local_318,(Mat *)local_128);
        cv::_OutputArray::_OutputArray(&local_330,local_2d0);
        cv::Sobel(&local_318,&local_330,5,0,1,(int)alpha,1.0,0.0,4);
        cv::_OutputArray::~_OutputArray(&local_330);
        cv::_InputArray::~_InputArray(&local_318);
        cv::_InputArray::_InputArray(&local_348,local_270);
        cv::_InputArray::_InputArray(&local_360,local_270);
        cv::_OutputArray::_OutputArray(&local_378,local_270);
        cv::multiply(&local_348,&local_360,&local_378,1.0,-1);
        cv::_OutputArray::~_OutputArray(&local_378);
        cv::_InputArray::~_InputArray(&local_360);
        cv::_InputArray::~_InputArray(&local_348);
        cv::_InputArray::_InputArray(&local_390,local_2d0);
        cv::_InputArray::_InputArray(&local_3a8,local_2d0);
        cv::_OutputArray::_OutputArray(&local_3c0,local_2d0);
        cv::multiply(&local_390,&local_3a8,&local_3c0,1.0,-1);
        cv::_OutputArray::~_OutputArray(&local_3c0);
        cv::_InputArray::~_InputArray(&local_3a8);
        cv::_InputArray::~_InputArray(&local_390);
        cv::Mat::Mat((Mat *)local_420);
        cv::operator+(local_580,local_270);
        cv::Mat::operator=((Mat *)local_420,(MatExpr *)local_580);
        cv::MatExpr::~MatExpr((MatExpr *)local_580);
        cv::_InputArray::_InputArray(&local_598,(Mat *)local_420);
        cv::_OutputArray::_OutputArray(&local_5b0,(Mat *)local_420);
        cv::sqrt(&local_598,&local_5b0);
        cv::_OutputArray::~_OutputArray(&local_5b0);
        cv::_InputArray::~_InputArray(&local_598);
        cv::abs(local_710);
        cv::Mat::operator=((Mat *)local_420,(MatExpr *)local_710);
        cv::MatExpr::~MatExpr((MatExpr *)local_710);
        cv::_InputArray::_InputArray(&local_728,(Mat *)local_420);
        cv::_InputOutputArray::_InputOutputArray(&local_740,(Mat *)local_420);
        p_Var7 = (_InputArray *)cv::noArray();
        cv::normalize(&local_728,&local_740,0.0,1.0,0x20,-1,p_Var7);
        cv::_InputOutputArray::~_InputOutputArray(&local_740);
        cv::_InputArray::~_InputArray(&local_728);
        cv::Mat::Mat(local_7a0);
        cv::_OutputArray::_OutputArray(&local_7b8,local_7a0);
        cv::Mat::convertTo((_OutputArray *)local_420,(int)&local_7b8,255.0,0.0);
        cv::_OutputArray::~_OutputArray(&local_7b8);
        cv::MatSize::operator()(local_820);
        cv::Scalar_<double>::Scalar_((Scalar_<double> *)&testValue,1.0);
        cv::Mat::Mat(local_818,local_820,5,&testValue);
        if (bVar3) {
          for (p_dash._4_4_ = 0; p_dash._4_4_ < _dashMask; p_dash._4_4_ = p_dash._4_4_ + 1) {
            p_dash._0_4_ = p_dash._4_4_ / 2 -
                           (p_dash._4_4_ / 2 - (p_dash._4_4_ - (p_dash._4_4_ >> 0x1f) >> 0x1f) &
                           0xfffffffeU);
            pfStack_850 = cv::Mat::ptr<float>(local_818,p_dash._4_4_);
            for (local_854 = 0; local_854 < local_80c; local_854 = local_854 + 1) {
              *pfStack_850 = (float)((int)((long)((ulong)(uint)((int)((long)local_854 / 2) >> 0x1f)
                                                  << 0x20 | (long)local_854 / 2 & 0xffffffffU) % 2)
                                    == (int)p_dash) * *pfStack_850;
              pfStack_850 = pfStack_850 + 1;
            }
          }
        }
        cv::_InputArray::_InputArray(&local_870,(Mat *)local_420);
        cv::_InputArray::_InputArray(&local_888,local_818);
        cv::_OutputArray::_OutputArray
                  ((_OutputArray *)
                   &planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(Mat *)local_420);
        cv::multiply(&local_870,&local_888,
                     (_OutputArray *)
                     &planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,1.0,-1);
        cv::_OutputArray::~_OutputArray
                  ((_OutputArray *)
                   &planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        cv::_InputArray::~_InputArray(&local_888);
        cv::_InputArray::~_InputArray(&local_870);
        std::allocator<cv::Mat>::allocator(&local_8b9);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
                  ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&i,3,&local_8b9);
        std::allocator<cv::Mat>::~allocator(&local_8b9);
        for (local_8c0 = 0; local_8c0 < 3; local_8c0 = local_8c0 + 1) {
          pvVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                             ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&i,(long)local_8c0);
          cv::_OutputArray::_OutputArray((_OutputArray *)&height,pvVar8);
          cv::Mat::convertTo((_OutputArray *)local_90,(int)&height,0.00392156862745098,0.0);
          cv::_OutputArray::~_OutputArray((_OutputArray *)&height);
        }
        i_1 = local_84;
        local_8e0 = _lbd;
        for (local_8e4 = 0; local_8e4 < 3; local_8e4 = local_8e4 + 1) {
          std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                    ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&i,(long)local_8e4);
          cv::operator*(1.0,local_ba8);
          cv::operator*(0.0,local_d08);
          cv::operator+(local_a48,(MatExpr *)local_ba8);
          pvVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                             ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&i,(long)local_8e4);
          cv::Mat::operator=(pvVar8,local_a48);
          cv::MatExpr::~MatExpr(local_a48);
          cv::MatExpr::~MatExpr((MatExpr *)local_d08);
          cv::MatExpr::~MatExpr((MatExpr *)local_ba8);
        }
        for (p_edges._4_4_ = 0; p_edges._4_4_ < local_8e0; p_edges._4_4_ = p_edges._4_4_ + 1) {
          p_blue = cv::Mat::ptr<float>((Mat *)local_420,p_edges._4_4_);
          pvVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                             ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&i,0);
          cv::Mat::ptr<float>(pvVar8,p_edges._4_4_);
          pvVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                             ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&i,1);
          p_red = cv::Mat::ptr<float>(pvVar8,p_edges._4_4_);
          pvVar8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                             ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&i,2);
          pfStack_d30 = cv::Mat::ptr<float>(pvVar8,p_edges._4_4_);
          for (local_d34 = 0; local_d34 < i_1; local_d34 = local_d34 + 1) {
            if ((float)dash <= *p_blue) {
              *pfStack_d30 = (1.0 - local_28) * *pfStack_d30 + local_28;
              *p_red = (1.0 - local_28) * *p_red + local_28;
            }
            p_red = p_red + 1;
            pfStack_d30 = pfStack_d30 + 1;
            p_blue = p_blue + 1;
          }
        }
        cv::Mat::Mat((Mat *)local_d98);
        cv::Mat::Mat(local_df8);
        cv::_InputArray::_InputArray(&local_e10,(vector<cv::Mat,_std::allocator<cv::Mat>_> *)&i);
        cv::_OutputArray::_OutputArray(&local_e28,(Mat *)local_d98);
        cv::merge(&local_e10,&local_e28);
        cv::_OutputArray::~_OutputArray(&local_e28);
        cv::_InputArray::~_InputArray(&local_e10);
        cv::_OutputArray::_OutputArray(&local_e40,local_df8);
        cv::Mat::convertTo((_OutputArray *)local_d98,(int)&local_e40,255.0,0.0);
        cv::_OutputArray::~_OutputArray(&local_e40);
        pcVar1 = argv[argc + -1];
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e60,pcVar1,&local_e61);
        cv::_InputArray::_InputArray(&local_e80,local_df8);
        local_e98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_e98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_e98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::vector(&local_e98);
        cv::imwrite(local_e60,&local_e80,(vector *)&local_e98);
        std::vector<int,_std::allocator<int>_>::~vector(&local_e98);
        cv::_InputArray::~_InputArray(&local_e80);
        std::__cxx11::string::~string(local_e60);
        std::allocator<char>::~allocator((allocator<char> *)&local_e61);
        argv_local._4_4_ = 0;
        cv::Mat::~Mat(local_df8);
        cv::Mat::~Mat((Mat *)local_d98);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
                  ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&i);
        cv::Mat::~Mat(local_818);
        cv::Mat::~Mat(local_7a0);
        cv::Mat::~Mat((Mat *)local_420);
        cv::Mat::~Mat(local_2d0);
        cv::Mat::~Mat(local_270);
      }
      cv::Mat::~Mat((Mat *)local_128);
    }
    cv::Mat::~Mat((Mat *)local_90);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char * const argv[])
{
  if (argc < 4)
  {
    std::cerr << "Missing arguments!\n";
    std::cerr << "Usage: " << argv[0] << " lbd_image image_to_merge result" << std::endl;
    return EXIT_FAILURE;
  }

  float threshold = 0.2;
  int sobelSize = 3;
  int dash = 0;
  float alpha = 0.7;

  int c = 0;
  while ( (c = getopt(argc, argv, "a:ds:t:")) != -1 )
  {
    switch (c)
    {
    case 'a':
      alpha = (float)atof(optarg);
      break;

    case 'd':
      dash = 1;
      break;

    case 's':
      sobelSize = atoi(optarg);
      break;

    case 't':
      threshold = (float)atof(optarg);
      threshold = MIN(MAX(0.0, threshold), 1.0);
      break;

    default:
      break;
    }
  }

  // Read LBD image
  cv::Mat lbd = cv::imread(argv[argc-3], 0);
  if (!lbd.data)
  {
    std::cerr << "Error reading; " << argv[argc-3] << std::endl;
    return EXIT_FAILURE;
  }

  // Read src image
  cv::Mat src = cv::imread(argv[argc-2], 0);
  if (!src.data)
  {
    std::cerr << "Error reading; " << argv[argc-2] << std::endl;
    return EXIT_FAILURE;
  }

  if (lbd.size() != src.size())
  {
    cv::Mat tmp;
    cv::resize(src, tmp, lbd.size());
    tmp.copyTo(src);
  }

  // Take gradient
  cv::Mat dx, dy;
  cv::Sobel(src, dx, CV_32F, 1, 0, sobelSize);
  cv::Sobel(src, dy, CV_32F, 0, 1, sobelSize);
  cv::multiply(dx, dx, dx);
  cv::multiply(dy, dy, dy);
  cv::Mat edges;
  edges = dx + dy;
  cv::sqrt(edges, edges);
  edges = cv::abs(edges);
  cv::normalize(edges, edges, 0, 1, cv::NORM_MINMAX);

  cv::Mat sobel;
  edges.convertTo(sobel, CV_8U, 255.0);

  // Create mask if needed
  cv::Mat dashMask(lbd.size(), CV_32FC1, cv::Scalar(1.0));
  if (dash > 0)
  {
    for (int y = 0; y < dashMask.rows; ++y)
    {
      int testValue = (y/2) % 2;
      float *p_dash = dashMask.ptr<float>(y);

      for (int x = 0; x < dashMask.cols; ++x)
        *p_dash++ *= ((x/2)%2 == testValue);
    }
  }
  cv::multiply(edges, dashMask, edges);

  // Merge step
  std::vector<cv::Mat> planes(3);
  for (int i = 0; i < 3; ++i)
    lbd.convertTo(planes[i], CV_32F, 1.0/255.0);

  int width = lbd.cols;
  int height = lbd.rows;

  for (int i = 0; i < 3; ++i)
    planes[i] = 1.0*planes[i] + 0.0*edges;

  for (int y = 0; y < height; ++y)
  {
    float const *p_edges = edges.ptr<float>(y);
    float *p_blue = planes[0].ptr<float>(y);
    float *p_green = planes[1].ptr<float>(y);
    float *p_red = planes[2].ptr<float>(y);

    for (int x = 0; x < width; ++x)
    {
      if (*p_edges >= threshold)
      {
        *p_red = alpha + (1.0-alpha)*(*p_red);
        *p_green = alpha + (1.0-alpha)*(*p_green);
      }
      p_blue++;
      p_green++;
      p_red++;
      p_edges++;
    }
  }

  cv::Mat colorf, color;
  cv::merge(planes, colorf);
  colorf.convertTo(color, CV_8U, 255.0);
  
  // Done
  cv::imwrite(argv[argc-1], color);

  return EXIT_SUCCESS;
}